

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O0

void __thiscall xmrig::CpuBackend::setJob(CpuBackend *this,Job *job)

{
  __normal_iterator<xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
  __last1;
  bool bVar1;
  ulong uVar2;
  Config *this_00;
  __normal_iterator<xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
  __first2;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *pvVar3;
  Miner *in_RSI;
  __normal_iterator<xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
  in_RDI;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> threads;
  CpuConfig *cpu;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *in_stack_ffffffffffffff78;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar4;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> local_30;
  CpuBackendPrivate *local_18;
  CpuConfig *this_01;
  
  this_01 = (CpuConfig *)in_RDI._M_current;
  uVar2 = (**(code **)(*(long *)in_RDI._M_current + 0x10))();
  if ((uVar2 & 1) == 0) {
    (**(code **)(*(long *)in_RDI._M_current + 0x58))();
  }
  else {
    this_00 = Base::config((Base *)**(undefined8 **)&((CpuConfig *)in_RDI._M_current)->m_enabled);
    __first2._M_current = (CpuLaunchData *)Config::cpu(this_00);
    local_18 = (CpuBackendPrivate *)__first2._M_current;
    Controller::miner((Controller *)**(undefined8 **)&((CpuConfig *)in_RDI._M_current)->m_enabled);
    CpuConfig::get(this_01,in_RSI);
    bVar1 = std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::empty
                      ((vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)
                       __first2._M_current);
    uVar4 = false;
    if (!bVar1) {
      in_stack_ffffffffffffff88 =
           (vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)
           std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::size
                     ((vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)
                      (*(long *)&((CpuConfig *)in_RDI._M_current)->m_enabled + 0x48));
      pvVar3 = (vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)
               std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::size
                         (&local_30);
      uVar4 = false;
      if (in_stack_ffffffffffffff88 == pvVar3) {
        std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::begin
                  (in_stack_ffffffffffffff78);
        std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::end
                  (in_stack_ffffffffffffff78);
        std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::begin
                  (in_stack_ffffffffffffff78);
        __last1._M_current._7_1_ = uVar4;
        __last1._M_current._0_7_ = in_stack_ffffffffffffff98;
        uVar4 = std::
                equal<__gnu_cxx::__normal_iterator<xmrig::CpuLaunchData*,std::vector<xmrig::CpuLaunchData,std::allocator<xmrig::CpuLaunchData>>>,__gnu_cxx::__normal_iterator<xmrig::CpuLaunchData*,std::vector<xmrig::CpuLaunchData,std::allocator<xmrig::CpuLaunchData>>>>
                          (in_RDI,__last1,__first2);
      }
    }
    if ((bool)uVar4 == false) {
      bVar1 = std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::empty
                        ((vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)
                         __first2._M_current);
      if (bVar1) {
        Log::print(WARNING,
                   "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (no suitable configuration found)\x1b[0m"
                   ,tag);
        (**(code **)(*(long *)in_RDI._M_current + 0x58))();
      }
      else {
        (**(code **)(*(long *)in_RDI._M_current + 0x58))();
        std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::operator=
                  ((vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)
                   __first2._M_current,in_stack_ffffffffffffff88);
        CpuBackendPrivate::start((CpuBackendPrivate *)__first2._M_current);
      }
    }
    std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::~vector
              ((vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)
               __first2._M_current);
  }
  return;
}

Assistant:

void xmrig::CpuBackend::setJob(const Job &job)
{
    if (!isEnabled()) {
        return stop();
    }

    const CpuConfig &cpu = d_ptr->controller->config()->cpu();

    std::vector<CpuLaunchData> threads = cpu.get(d_ptr->controller->miner());
    if (!d_ptr->threads.empty() && d_ptr->threads.size() == threads.size() && std::equal(d_ptr->threads.begin(), d_ptr->threads.end(), threads.begin())) {
        return;
    }

    if (threads.empty()) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (no suitable configuration found)"), tag);

        return stop();
    }

    stop();

    d_ptr->threads = std::move(threads);
    d_ptr->start();
}